

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O3

string * __thiscall
soul::CodeLocation::getSourceLine_abi_cxx11_(string *__return_storage_ptr__,CodeLocation *this)

{
  CodeLocation e;
  CodeLocation s;
  CodeLocation local_40;
  CodeLocation local_30;
  
  if ((this->location).data == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    getStartOfLine(&local_30);
    getEndOfLine(&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_30.location.data,local_40.location.data);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.sourceCode.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.sourceCode.object);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocation::getSourceLine() const
{
    if (location.getAddress() == nullptr)
        return {};

    auto s = getStartOfLine();
    auto e = getEndOfLine();

    return { s.location.getAddress(),
             e.location.getAddress() };
}